

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect3.c
# Opt level: O0

void lws_client_dns_retry_timeout(lws_sorted_usec_list_t *sul)

{
  lws_dll2 **wsi_00;
  lws_log_cx *plVar1;
  lws *plVar2;
  lws *wsi;
  lws_sorted_usec_list_t *sul_local;
  
  wsi_00 = &sul[-0xb].list.next;
  plVar1 = lwsl_wsi_get_cx((lws *)wsi_00);
  _lws_log_cx(plVar1,lws_log_prepend_wsi,wsi_00,8,"lws_client_dns_retry_timeout","dns retry");
  plVar2 = lws_client_connect_2_dnsreq((lws *)wsi_00);
  if (plVar2 == (lws *)0x0) {
    plVar1 = lwsl_wsi_get_cx((lws *)wsi_00);
    _lws_log_cx(plVar1,lws_log_prepend_wsi,wsi_00,4,"lws_client_dns_retry_timeout",
                "DNS lookup failed");
  }
  return;
}

Assistant:

void
lws_client_dns_retry_timeout(lws_sorted_usec_list_t *sul)
{
	struct lws *wsi = lws_container_of(sul, struct lws,
					   sul_connect_timeout);

	/*
	 * This limits the amount of dns lookups we will try before
	 * giving up and failing... it reuses sul_connect_timeout, which
	 * isn't officially used until we connected somewhere.
	 */

	lwsl_wsi_info(wsi, "dns retry");
	if (!lws_client_connect_2_dnsreq(wsi))
		lwsl_wsi_notice(wsi, "DNS lookup failed");
}